

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringView.cpp
# Opt level: O0

BasicStringView<const_char> __thiscall
Corrade::Containers::BasicStringView<const_char>::exceptPrefix
          (BasicStringView<const_char> *this,StringView prefix)

{
  StringView value;
  bool bVar1;
  ostream *output;
  Debug *this_00;
  size_t size;
  BasicStringView<const_char> BVar2;
  Flags local_69;
  Error local_68;
  BasicStringView<const_char> *local_40;
  char *local_38;
  BasicStringView<const_char> *local_30;
  BasicStringView<const_char> *this_local;
  StringView prefix_local;
  
  local_38 = (char *)prefix._sizePlusFlags;
  local_40 = (BasicStringView<const_char> *)prefix._data;
  local_30 = this;
  this_local = local_40;
  prefix_local._data = local_38;
  bVar1 = hasPrefix(this,prefix);
  if (!bVar1) {
    output = Utility::Error::defaultOutput();
    EnumSet<Corrade::Utility::Debug::Flag,_(unsigned_char)'\xff'>::EnumSet(&local_69);
    Utility::Error::Error(&local_68,output,local_69);
    this_00 = Utility::Debug::operator<<
                        (&local_68.super_Debug,
                         "Containers::StringView::exceptPrefix(): string doesn\'t begin with");
    value._sizePlusFlags = (size_t)prefix_local._data;
    value._data = (char *)this_local;
    Utility::Debug::operator<<(this_00,value);
    Utility::Error::~Error(&local_68);
    abort();
  }
  size = BasicStringView<const_char>::size((BasicStringView<const_char> *)&this_local);
  BVar2 = exceptPrefix(this,size);
  return BVar2;
}

Assistant:

BasicStringView<T> BasicStringView<T>::exceptPrefix(const StringView prefix) const {
    /* Stripping a hardcoded prefix is unlikely to be called in a tight loop --
       and the main purpose of this API is this check -- so it shouldn't be a
       debug assert */
    CORRADE_ASSERT(hasPrefix(prefix),
        "Containers::StringView::exceptPrefix(): string doesn't begin with" << prefix, {});
    return exceptPrefix(prefix.size());
}